

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

ly_set * lys_xpath_atomize(lys_node *cur_snode,lyxp_node_type cur_snode_type,char *expr,int options)

{
  int iVar1;
  lys_module *module;
  bool bVar2;
  uint local_74;
  uint32_t i;
  ly_set *ret_set;
  lyxp_set set;
  uint local_2c;
  int options_local;
  char *expr_local;
  lys_node *plStack_18;
  lyxp_node_type cur_snode_type_local;
  lys_node *cur_snode_local;
  
  if ((cur_snode == (lys_node *)0x0) || (expr == (char *)0x0)) {
    cur_snode_local = (lys_node *)0x0;
  }
  else {
    plStack_18 = cur_snode;
    if ((cur_snode_type == LYXP_NODE_ROOT) || (cur_snode_type == LYXP_NODE_ROOT_CONFIG)) {
      do {
        module = lys_node_module(plStack_18);
        plStack_18 = lys_getnext((lys_node *)0x0,(lys_node *)0x0,module,0);
        bVar2 = false;
        if (cur_snode_type == LYXP_NODE_ROOT_CONFIG) {
          bVar2 = (plStack_18->flags & 2) != 0;
        }
      } while (bVar2);
    }
    memset(&ret_set,0,0x30);
    if ((options & 1U) == 0) {
      if ((options & 2U) == 0) {
        local_2c = options | 4;
      }
      else {
        local_2c = options & 0xfffffffdU | 0x10;
      }
    }
    else {
      local_2c = options & 0xfffffffeU | 8;
    }
    iVar1 = lyxp_atomize(expr,plStack_18,cur_snode_type,(lyxp_set *)&ret_set,local_2c);
    if (iVar1 == 0) {
      cur_snode_local = (lys_node *)ly_set_new();
      for (local_74 = 0; local_74 < (uint)set.val._8_4_; local_74 = local_74 + 1) {
        if ((*(int *)(set._8_8_ + 8 + (ulong)local_74 * 0x10) == 2) &&
           (iVar1 = ly_set_add((ly_set *)cur_snode_local,
                               *(void **)(set._8_8_ + (ulong)local_74 * 0x10),1), iVar1 == -1)) {
          ly_set_free((ly_set *)cur_snode_local);
          free((void *)set._8_8_);
          return (ly_set *)0x0;
        }
      }
      free((void *)set._8_8_);
    }
    else {
      free((void *)set._8_8_);
      ly_vlog(LYE_SPEC,LY_VLOG_LYS,plStack_18,"Resolving XPath expression \"%s\" failed.",expr);
      cur_snode_local = (lys_node *)0x0;
    }
  }
  return (ly_set *)cur_snode_local;
}

Assistant:

ly_set *
lys_xpath_atomize(const struct lys_node *cur_snode, enum lyxp_node_type cur_snode_type, const char *expr, int options)
{
    struct lyxp_set set;
    struct ly_set *ret_set;
    uint32_t i;

    if (!cur_snode || !expr) {
        return NULL;
    }

    /* adjust the root */
    if ((cur_snode_type == LYXP_NODE_ROOT) || (cur_snode_type == LYXP_NODE_ROOT_CONFIG)) {
        do {
            cur_snode = lys_getnext(NULL, NULL, lys_node_module(cur_snode), 0);
        } while ((cur_snode_type == LYXP_NODE_ROOT_CONFIG) && (cur_snode->flags & LYS_CONFIG_R));
    }

    memset(&set, 0, sizeof set);

    if (options & LYXP_MUST) {
        options &= ~LYXP_MUST;
        options |= LYXP_SNODE_MUST;
    } else if (options & LYXP_WHEN) {
        options &= ~LYXP_WHEN;
        options |= LYXP_SNODE_WHEN;
    } else {
        options |= LYXP_SNODE;
    }

    if (lyxp_atomize(expr, cur_snode, cur_snode_type, &set, options)) {
        free(set.val.snodes);
        LOGVAL(LYE_SPEC, LY_VLOG_LYS, cur_snode, "Resolving XPath expression \"%s\" failed.", expr);
        return NULL;
    }

    ret_set = ly_set_new();

    for (i = 0; i < set.used; ++i) {
        switch (set.val.snodes[i].type) {
        case LYXP_NODE_ELEM:
            if (ly_set_add(ret_set, set.val.snodes[i].snode, LY_SET_OPT_USEASLIST) == -1) {
                ly_set_free(ret_set);
                free(set.val.snodes);
                return NULL;
            }
            break;
        default:
            /* ignore roots, text and attr should not ever appear */
            break;
        }
    }

    free(set.val.snodes);
    return ret_set;
}